

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O2

UBool __thiscall icu_63::MessagePattern::operator==(MessagePattern *this,MessagePattern *other)

{
  int length;
  UBool UVar1;
  
  UVar1 = '\x01';
  if (this != other) {
    if (((this->aposMode == other->aposMode) &&
        (UVar1 = UnicodeString::operator==(&this->msg,&other->msg), UVar1 != '\0')) &&
       (length = this->partsLength, length == other->partsLength)) {
      if (length == 0) {
        return '\x01';
      }
      UVar1 = MessagePatternList<icu_63::MessagePattern::Part,_32>::equals
                        (&this->partsList->
                          super_MessagePatternList<icu_63::MessagePattern::Part,_32>,
                         &other->partsList->
                          super_MessagePatternList<icu_63::MessagePattern::Part,_32>,length);
      return UVar1 != '\0';
    }
    UVar1 = '\0';
  }
  return UVar1;
}

Assistant:

UBool
MessagePattern::operator==(const MessagePattern &other) const {
    if(this==&other) {
        return TRUE;
    }
    return
        aposMode==other.aposMode &&
        msg==other.msg &&
        // parts.equals(o.parts)
        partsLength==other.partsLength &&
        (partsLength==0 || partsList->equals(*other.partsList, partsLength));
    // No need to compare numericValues if msg and parts are the same.
}